

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O0

void __thiscall muduo::Thread::start(Thread *this)

{
  SourceFile file;
  int iVar1;
  SourceFile *name;
  LogStream *str;
  void *__stat_loc;
  pid_t *in_RDI;
  ThreadData *data;
  ThreadData *in_stack_ffffffffffffefb0;
  Logger *this_00;
  function<void_()> *in_stack_ffffffffffffefb8;
  CountDownLatch *in_stack_ffffffffffffefc0;
  SourceFile *this_01;
  ThreadFunc *in_stack_ffffffffffffefd8;
  ThreadData *in_stack_ffffffffffffefe0;
  Logger local_1018;
  undefined1 local_3d;
  SourceFile *local_10;
  
  *(undefined1 *)in_RDI = 1;
  name = (SourceFile *)operator_new(0x50);
  local_3d = 1;
  std::function<void_()>::function
            ((function<void_()> *)in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8);
  detail::ThreadData::ThreadData
            (in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,(string *)name,in_RDI,
             in_stack_ffffffffffffefc0);
  local_3d = 0;
  std::function<void_()>::~function((function<void_()> *)0x1501ae);
  __stat_loc = (void *)0x0;
  local_10 = name;
  iVar1 = pthread_create((pthread_t *)(in_RDI + 2),(pthread_attr_t *)0x0,detail::startThread,name);
  if (iVar1 == 0) {
    CountDownLatch::wait((CountDownLatch *)(in_RDI + 0x16),__stat_loc);
  }
  else {
    *(char *)in_RDI = '\0';
    this_01 = local_10;
    if (local_10 != (SourceFile *)0x0) {
      detail::ThreadData::~ThreadData(in_stack_ffffffffffffefb0);
      operator_delete(this_01);
    }
    Logger::SourceFile::SourceFile<99>(this_01,(char (*) [99])in_stack_ffffffffffffefb8);
    this_00 = &local_1018;
    file._8_8_ = name;
    file.data_ = (char *)in_RDI;
    Logger::Logger((Logger *)this_01,file,(int)((ulong)in_stack_ffffffffffffefb8 >> 0x20),
                   SUB81((ulong)in_stack_ffffffffffffefb8 >> 0x18,0));
    str = Logger::stream(this_00);
    LogStream::operator<<((LogStream *)this_01,(char *)str);
    Logger::~Logger((Logger *)in_stack_ffffffffffffefe0);
  }
  return;
}

Assistant:

void Thread::start()
{
  assert(!started_);
  started_ = true;
  // FIXME: move(func_)
  detail::ThreadData* data = new detail::ThreadData(func_, name_, &tid_, &latch_);
  if (pthread_create(&pthreadId_, NULL, &detail::startThread, data))
  {
    started_ = false;
    delete data; // or no delete?
    LOG_SYSFATAL << "Failed in pthread_create";
  }
  else
  {
    latch_.wait();
    assert(tid_ > 0);
  }
}